

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingCXX.cxx
# Opt level: O1

CommandLineArguments * __thiscall
cmsys::Encoding::CommandLineArguments::operator=
          (CommandLineArguments *this,CommandLineArguments *other)

{
  pointer ppcVar1;
  char *pcVar2;
  ulong uVar3;
  
  if (this != other) {
    ppcVar1 = (this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppcVar1) {
      uVar3 = 0;
      do {
        free(ppcVar1[uVar3]);
        uVar3 = uVar3 + 1;
        ppcVar1 = (this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar3 < (ulong)((long)(this->argv_).
                                     super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3));
    }
    std::vector<char_*,_std::allocator<char_*>_>::resize
              (&this->argv_,
               (long)(other->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(other->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3);
    ppcVar1 = (this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppcVar1) {
      uVar3 = 0;
      do {
        pcVar2 = (other->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar3];
        if (pcVar2 == (char *)0x0) {
          pcVar2 = (char *)0x0;
        }
        else {
          pcVar2 = strdup(pcVar2);
        }
        ppcVar1[uVar3] = pcVar2;
        uVar3 = uVar3 + 1;
        ppcVar1 = (this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar3 < (ulong)((long)(this->argv_).
                                     super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3));
    }
  }
  return this;
}

Assistant:

Encoding::CommandLineArguments& Encoding::CommandLineArguments::operator=(
  const CommandLineArguments& other)
{
  if (this != &other) {
    size_t i;
    for (i = 0; i < this->argv_.size(); i++) {
      free(this->argv_[i]);
    }

    this->argv_.resize(other.argv_.size());
    for (i = 0; i < this->argv_.size(); i++) {
      this->argv_[i] = other.argv_[i] ? strdup(other.argv_[i]) : nullptr;
    }
  }

  return *this;
}